

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

void secp256k1_musig_aggnonce_save(secp256k1_musig_aggnonce *nonce,secp256k1_ge *ges)

{
  uchar *in_RSI;
  undefined4 *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar1;
  
  *in_RDI = 0x67e4b7a8;
  for (iVar1 = 0; iVar1 < 2; iVar1 = iVar1 + 1) {
    secp256k1_ge_to_bytes_ext(in_RSI,(secp256k1_ge *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  }
  return;
}

Assistant:

static void secp256k1_musig_aggnonce_save(secp256k1_musig_aggnonce* nonce, const secp256k1_ge* ges) {
    int i;
    memcpy(&nonce->data[0], secp256k1_musig_aggnonce_magic, 4);
    for (i = 0; i < 2; i++) {
        secp256k1_ge_to_bytes_ext(&nonce->data[4 + 64*i], &ges[i]);
    }
}